

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImageFill(gdImagePtr im,int x,int y,int nc)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int *ptr;
  int *piVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int *piVar15;
  char *pcVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  uint x_00;
  int *local_a8;
  int *local_a0;
  
  if ((im->trueColor == 0) && (im->colorsTotal <= nc)) {
    return;
  }
  iVar1 = im->alphaBlendingFlag;
  im->alphaBlendingFlag = 0;
  if (nc == -5) {
    if (im->tile == (gdImageStruct *)0x0) goto LAB_0010e8fc;
    uVar2 = im->sx;
    iVar8 = im->sy;
    iVar6 = overflow2(iVar8,uVar2);
    if (((iVar6 != 0) || (iVar6 = overflow2(0x10,(im->sx * im->sy) / 4), iVar6 != 0)) ||
       (ptr = (int *)gdCalloc((long)im->sx * (long)im->sy,1), ptr == (int *)0x0)) goto LAB_0010e8fc;
    piVar10 = (int *)gdMalloc((long)((im->sx * im->sy) / 4) << 4);
    if (piVar10 != (int *)0x0) {
      lVar17 = (long)iVar8;
      iVar6 = gdImageGetPixel(im,x,y);
      iVar11 = im->sx * im->sy;
      local_a0 = piVar10;
      if ((y + 1 < iVar8 && -2 < y) && 3 < iVar11) {
        *piVar10 = y;
        piVar10[1] = x;
        piVar10[2] = x;
        piVar10[3] = 1;
        local_a0 = piVar10 + 4;
      }
      if ((local_a0 < piVar10 + (long)(iVar11 / 4) * 4) && (y < iVar8 && -1 < y)) {
        *local_a0 = y + 1;
        local_a0[1] = x;
        local_a0[2] = x;
        local_a0[3] = -1;
        local_a0 = local_a0 + 4;
      }
LAB_0010e2a7:
      if (piVar10 < local_a0) {
        piVar15 = local_a0 + -4;
        iVar11 = local_a0[-4];
        iVar9 = local_a0[-1];
        iVar14 = iVar9 + iVar11;
        uVar18 = local_a0[-3];
        uVar20 = (ulong)(int)uVar18;
        iVar3 = local_a0[-2];
        lVar13 = (long)iVar14;
        uVar22 = 0xffffffff;
        if ((int)uVar18 < -1) {
          uVar22 = uVar18;
        }
        pcVar16 = (char *)(lVar17 * uVar20 + lVar13 + (long)ptr);
        for (; -1 < (long)uVar20; uVar20 = uVar20 - 1) {
          if (*pcVar16 != '\0') goto LAB_0010e35a;
          iVar19 = (int)uVar20;
          iVar7 = gdImageGetPixel(im,iVar19,iVar14);
          if (iVar7 != iVar6) goto LAB_0010e35a;
          iVar7 = gdImageTileGet(im,iVar19,iVar14);
          *pcVar16 = '\x01';
          gdImageSetPixel(im,iVar19,iVar14,iVar7);
          pcVar16 = pcVar16 + -lVar17;
        }
        uVar20 = (ulong)uVar22;
LAB_0010e35a:
        uVar22 = (uint)uVar20;
        if ((int)uVar18 <= (int)uVar22) goto LAB_0010e4e3;
        x_00 = uVar22 + 1;
        if ((((int)x_00 < (int)uVar18) && (piVar15 < piVar10 + (long)((im->sx * im->sy) / 4) * 4))
           && (iVar11 < iVar8 && -1 < iVar11)) {
          local_a0[-4] = iVar14;
          local_a0[-3] = x_00;
          local_a0[-2] = uVar18 - 1;
          local_a0[-1] = -iVar9;
          piVar15 = local_a0;
        }
        uVar18 = uVar18 + 1;
        local_a0 = piVar15;
        do {
          uVar20 = (ulong)(int)uVar18;
          uVar22 = uVar2;
          if ((int)uVar2 < (int)uVar18) {
            uVar22 = uVar18;
          }
          pcVar16 = (char *)(lVar17 * uVar20 + lVar13 + (long)ptr);
          for (; (long)uVar20 < (long)(int)uVar2; uVar20 = uVar20 + 1) {
            if (*pcVar16 != '\0') goto LAB_0010e44d;
            iVar19 = (int)uVar20;
            iVar7 = gdImageGetPixel(im,iVar19,iVar14);
            if (iVar7 != iVar6) goto LAB_0010e44d;
            iVar7 = gdImageTileGet(im,iVar19,iVar14);
            *pcVar16 = '\x01';
            gdImageSetPixel(im,iVar19,iVar14,iVar7);
            pcVar16 = pcVar16 + lVar17;
          }
          uVar20 = (ulong)uVar22;
LAB_0010e44d:
          uVar22 = (uint)uVar20;
          iVar7 = im->sx;
          iVar19 = im->sy;
          if ((local_a0 < piVar10 + (long)((iVar7 * iVar19) / 4) * 4) &&
             (iVar14 + iVar9 < iVar8 && -1 < iVar14 + iVar9)) {
            *local_a0 = iVar14;
            local_a0[1] = x_00;
            local_a0[2] = uVar22 - 1;
            local_a0[3] = iVar9;
            local_a0 = local_a0 + 4;
          }
          iVar12 = iVar3 + 1;
          piVar15 = local_a0;
          if (((iVar12 < (int)uVar22) && (local_a0 < piVar10 + (long)((iVar7 * iVar19) / 4) * 4)) &&
             (iVar11 < iVar8 && -1 < iVar11)) {
            *local_a0 = iVar14;
            local_a0[1] = iVar12;
            local_a0[2] = uVar22 - 1;
            local_a0[3] = -iVar9;
            piVar15 = local_a0 + 4;
          }
LAB_0010e4e3:
          local_a0 = piVar15;
          lVar21 = (long)(int)uVar22;
          pcVar16 = (char *)((lVar21 + 1) * lVar17 + lVar13 + (long)ptr);
          x_00 = uVar22;
          while( true ) {
            x_00 = x_00 + 1;
            if (iVar3 <= lVar21) goto LAB_0010e2a7;
            if ((*pcVar16 == '\0') &&
               (iVar7 = gdImageGetPixel(im,x_00,iVar14), uVar18 = x_00, iVar7 == iVar6)) break;
            pcVar16 = pcVar16 + lVar17;
            lVar21 = lVar21 + 1;
          }
        } while( true );
      }
      gdFree(ptr);
      ptr = piVar10;
    }
  }
  else {
    uVar2 = im->sx;
    iVar8 = im->sy;
    iVar6 = gdImageGetPixel(im,x,y);
    if ((x < 0 || iVar6 == nc) || (iVar8 < y || (y < 0 || (int)uVar2 < x))) goto LAB_0010e8fc;
    iVar11 = x;
    if (uVar2 < 4) {
      do {
        iVar8 = gdImageGetPixel(im,iVar11,y);
        if (iVar8 != iVar6) break;
        gdImageSetPixel(im,iVar11,y,nc);
        bVar5 = iVar11 < im->sx + -1;
        iVar11 = iVar11 + 1;
      } while ((bVar5) || (bVar5 = y < im->sy + -1, iVar11 = x, y = y + 1, bVar5));
      goto LAB_0010e8fc;
    }
    iVar11 = overflow2(iVar8,uVar2);
    if (iVar11 != 0) {
      return;
    }
    iVar11 = overflow2(0x10,(im->sx * im->sy) / 4);
    if (iVar11 != 0) {
      return;
    }
    ptr = (int *)gdMalloc((long)((im->sx * im->sy) / 4) << 4);
    if (ptr == (int *)0x0) {
      return;
    }
    iVar11 = im->sx * im->sy;
    local_a8 = ptr;
    if (y + 1 < iVar8 && 3 < iVar11) {
      *ptr = y;
      ptr[1] = x;
      ptr[2] = x;
      ptr[3] = 1;
      local_a8 = ptr + 4;
    }
    if (y < iVar8 && local_a8 < ptr + (long)(iVar11 / 4) * 4) {
      *local_a8 = y + 1;
      local_a8[1] = x;
      local_a8[2] = x;
      local_a8[3] = -1;
      local_a8 = local_a8 + 4;
    }
LAB_0010e6dc:
    if (ptr < local_a8) {
      piVar10 = local_a8 + -4;
      iVar11 = local_a8[-4];
      iVar9 = local_a8[-3];
      iVar3 = local_a8[-1];
      iVar19 = iVar3 + iVar11;
      iVar14 = local_a8[-2];
      iVar7 = iVar9;
      while ((-1 < iVar7 && (iVar12 = gdImageGetPixel(im,iVar7,iVar19), iVar12 == iVar6))) {
        gdImageSetPixel(im,iVar7,iVar19,nc);
        iVar7 = iVar7 + -1;
      }
      if (iVar9 <= iVar7) goto LAB_0010e8a9;
      iVar12 = iVar7 + 1;
      if (((iVar12 < iVar9) && (piVar10 < ptr + (long)((im->sx * im->sy) / 4) * 4)) &&
         (iVar11 < iVar8 && -1 < iVar11)) {
        local_a8[-4] = iVar19;
        local_a8[-3] = iVar12;
        local_a8[-2] = iVar9 + -1;
        local_a8[-1] = -iVar3;
        piVar10 = local_a8;
      }
      iVar7 = iVar9 + 1;
      local_a8 = piVar10;
      do {
        while ((iVar7 <= (int)uVar2 && (iVar9 = gdImageGetPixel(im,iVar7,iVar19), iVar9 == iVar6)))
        {
          gdImageSetPixel(im,iVar7,iVar19,nc);
          iVar7 = iVar7 + 1;
        }
        iVar9 = im->sx;
        iVar4 = im->sy;
        if ((local_a8 < ptr + (long)((iVar9 * iVar4) / 4) * 4) &&
           (iVar19 + iVar3 < iVar8 && -1 < iVar19 + iVar3)) {
          *local_a8 = iVar19;
          local_a8[1] = iVar12;
          local_a8[2] = iVar7 + -1;
          local_a8[3] = iVar3;
          local_a8 = local_a8 + 4;
        }
        iVar12 = iVar14 + 1;
        piVar10 = local_a8;
        if (((iVar12 < iVar7) && (local_a8 < ptr + (long)((iVar9 * iVar4) / 4) * 4)) &&
           (iVar11 < iVar8 && -1 < iVar11)) {
          *local_a8 = iVar19;
          local_a8[1] = iVar12;
          local_a8[2] = iVar7 + -1;
          local_a8[3] = -iVar3;
          piVar10 = local_a8 + 4;
        }
LAB_0010e8a9:
        do {
          local_a8 = piVar10;
          if (iVar14 <= iVar7) goto LAB_0010e6dc;
          iVar12 = iVar7 + 1;
          iVar9 = gdImageGetPixel(im,iVar12,iVar19);
          iVar7 = iVar12;
          piVar10 = local_a8;
        } while (iVar9 != iVar6);
      } while( true );
    }
  }
  gdFree(ptr);
LAB_0010e8fc:
  im->alphaBlendingFlag = iVar1;
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFill(gdImagePtr im, int x, int y, int nc)
{
	int l, x1, x2, dy;
	int oc;   /* old pixel value */
	int wx2,wy2;

	int alphablending_bak;

	/* stack of filled segments */
	/* struct seg stack[FILL_MAX],*sp = stack; */
	struct seg *stack;
	struct seg *sp;

	if (!im->trueColor && nc > (im->colorsTotal - 1)) {
		return;
	}

	alphablending_bak = im->alphaBlendingFlag;
	im->alphaBlendingFlag = 0;

	if (nc==gdTiled) {
		_gdImageFillTiled(im,x,y,nc);
		im->alphaBlendingFlag = alphablending_bak;
		return;
	}

	wx2=im->sx;
	wy2=im->sy;
	oc = gdImageGetPixel(im, x, y);
	if (oc==nc || x<0 || x>wx2 || y<0 || y>wy2) {
		im->alphaBlendingFlag = alphablending_bak;
		return;
	}

	/* Do not use the 4 neighbors implementation with
	* small images
	*/
	if (im->sx < 4) {
		int ix = x, iy = y, c;
		do {
			do {
				c = gdImageGetPixel(im, ix, iy);
				if (c != oc) {
					goto done;
				}
				gdImageSetPixel(im, ix, iy, nc);
			} while(ix++ < (im->sx -1));
			ix = x;
		} while(iy++ < (im->sy -1));
		goto done;
	}

	if(overflow2(im->sy, im->sx)) {
		return;
	}

	if(overflow2(sizeof(struct seg), ((im->sy * im->sx) / 4))) {
		return;
	}

	stack = (struct seg *)gdMalloc(sizeof(struct seg) * ((int)(im->sy*im->sx)/4));
	if (!stack) {
		return;
	}
	sp = stack;

	/* required! */
	FILL_PUSH(y,x,x,1);
	/* seed segment (popped 1st) */
	FILL_PUSH(y+1, x, x, -1);
	while (sp>stack) {
		FILL_POP(y, x1, x2, dy);

		for (x=x1; x>=0 && gdImageGetPixel(im,x, y)==oc; x--) {
			gdImageSetPixel(im,x, y, nc);
		}
		if (x>=x1) {
			goto skip;
		}
		l = x+1;

		/* leak on left? */
		if (l<x1) {
			FILL_PUSH(y, l, x1-1, -dy);
		}
		x = x1+1;
		do {
			for (; x<=wx2 && gdImageGetPixel(im,x, y)==oc; x++) {
				gdImageSetPixel(im, x, y, nc);
			}
			FILL_PUSH(y, l, x-1, dy);
			/* leak on right? */
			if (x>x2+1) {
				FILL_PUSH(y, x2+1, x-1, -dy);
			}
skip:
			for (x++; x<=x2 && (gdImageGetPixel(im, x, y)!=oc); x++);

			l = x;
		} while (x<=x2);
	}

	gdFree(stack);

done:
	im->alphaBlendingFlag = alphablending_bak;
}